

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

ssize_t __thiscall phosg::read_abi_cxx11_(phosg *this,int __fd,void *__buf,size_t __nbytes)

{
  void *__n;
  io_error *this_00;
  
  *(phosg **)this = this + 0x10;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (size_type)__buf,'\0');
  __n = (void *)::read(__fd,*(void **)this,(size_t)__buf);
  if (-1 < (long)__n) {
    if (__n != __buf) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (size_type)__n,'\0');
    }
    return (ssize_t)this;
  }
  this_00 = (io_error *)__cxa_allocate_exception(0x20);
  io_error::io_error(this_00,__fd);
  __cxa_throw(this_00,&io_error::typeinfo,io_error::~io_error);
}

Assistant:

string read(int fd, size_t size) {
  string data(size, '\0');
  ssize_t ret_size = ::read(fd, data.data(), size);
  if (ret_size < 0) {
    throw io_error(fd);
  } else if (ret_size != static_cast<ssize_t>(size)) {
    data.resize(ret_size);
  }
  return data;
}